

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O1

void __thiscall Fl_Scroll_Type::copy_properties(Fl_Scroll_Type *this)

{
  Fl_Widget *pFVar1;
  Fl_Widget *pFVar2;
  
  Fl_Widget_Type::copy_properties((Fl_Widget_Type *)this);
  pFVar1 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget;
  pFVar2 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  (*pFVar1->_vptr_Fl_Widget[4])
            (pFVar1,(ulong)(uint)pFVar2[1].w_,(ulong)(uint)pFVar2[1].h_,(ulong)(uint)pFVar1->w_,
             (ulong)(uint)pFVar1->h_);
  pFVar1->type_ = pFVar2->type_;
  *(undefined4 *)((long)&pFVar1[2].user_data_ + 4) =
       *(undefined4 *)((long)&pFVar2[2].user_data_ + 4);
  *(undefined4 *)&pFVar1[3].label_.field_0x2c = *(undefined4 *)&pFVar2[3].label_.field_0x2c;
  return;
}

Assistant:

void Fl_Scroll_Type::copy_properties() {
  Fl_Group_Type::copy_properties();
  Fl_Scroll *s = (Fl_Scroll*)o, *d = (Fl_Scroll*)live_widget;
  d->position(s->xposition(), s->yposition());
  d->type(s->type()); // TODO: get this flag from Fl_Scroll_Type!
  d->scrollbar.align(s->scrollbar.align());
  d->hscrollbar.align(s->hscrollbar.align());
}